

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O2

char * sfnt_get_ps_name(TT_Face face)

{
  char cVar1;
  FT_UInt FVar2;
  FT_Memory pFVar3;
  TT_NameRec *pTVar4;
  FT_Stream pFVar5;
  void *pvVar6;
  FT_Memory memory;
  FT_Bool FVar7;
  byte bVar8;
  FT_UInt32 FVar9;
  FT_UInt32 FVar10;
  FT_UInt32 FVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  undefined8 uVar15;
  long lVar16;
  uint uVar17;
  uint *puVar18;
  int *piVar19;
  uint uVar20;
  FT_UInt32 FVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  FT_Byte *data;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  byte *pbVar30;
  char *pcVar31;
  byte *pbVar32;
  bool bVar33;
  char *local_70;
  undefined8 local_68;
  FT_Int win;
  uint local_5c [3];
  long lStack_50;
  FT_Error error;
  FT_MM_Var *mm_var;
  int iStack_40;
  FT_UInt num_coords;
  FT_Int apple;
  int local_34;
  FT_Int win_1;
  FT_Int apple_1;
  
  if (face->postscript_name != (char *)0x0) {
    return face->postscript_name;
  }
  if ((face->blend == (GX_Blend)0x0) ||
     ((((face->root).face_index & 0x7fff0000) == 0 && (((face->root).face_flags & 0x8000) == 0)))) {
    FVar7 = sfnt_get_name_id(face,6,(FT_Int *)&local_68,&stack0xffffffffffffffc0);
    if (FVar7 == '\0') {
      return (char *)0x0;
    }
    pFVar3 = (face->root).memory;
    pTVar4 = (face->name_table).names;
    pFVar5 = (face->name_table).stream;
    if ((long)(int)local_68 == -1) {
      pcVar12 = get_apple_string(pFVar3,pFVar5,pTVar4 + iStack_40,sfnt_is_postscript,'\x01');
    }
    else {
      pcVar12 = get_win_string(pFVar3,pFVar5,pTVar4 + (int)local_68,sfnt_is_postscript,'\x01');
    }
    goto LAB_00219b85;
  }
  pFVar3 = (face->root).memory;
  pvVar6 = face->mm;
  if (face->var_postscript_prefix == (char *)0x0) {
    FVar7 = sfnt_get_name_id(face,0x19,&apple,&local_34);
    if (((FVar7 != '\0') || (FVar7 = sfnt_get_name_id(face,0x10,&apple,&local_34), FVar7 != '\0'))
       || (FVar7 = sfnt_get_name_id(face,1,&apple,&local_34), FVar7 != '\0')) {
      memory = (face->root).memory;
      pTVar4 = (face->name_table).names;
      pFVar5 = (face->name_table).stream;
      if ((long)apple == -1) {
        pcVar12 = get_apple_string(memory,pFVar5,pTVar4 + local_34,sfnt_is_alphanumeric,'\0');
      }
      else {
        pcVar12 = get_win_string(memory,pFVar5,pTVar4 + apple,sfnt_is_alphanumeric,'\0');
      }
      sVar13 = strlen(pcVar12);
      uVar22 = (uint)sVar13;
      if (0x5b < uVar22) {
        pcVar12[0x5b] = '\0';
        uVar22 = 0x5b;
      }
      face->var_postscript_prefix = pcVar12;
      face->var_postscript_prefix_len = uVar22;
      goto LAB_00219467;
    }
LAB_002195f7:
    pcVar12 = (char *)0x0;
  }
  else {
LAB_00219467:
    (**(code **)((long)pvVar6 + 0x40))
              (face,(long)&mm_var + 4,&stack0xffffffffffffffc0,0,&stack0xffffffffffffffb0);
    uVar28 = (face->root).face_index & 0x7fff0000;
    if ((uVar28 == 0) || (((face->root).face_flags & 0x8000) != 0)) {
LAB_002195c8:
      lVar16 = *(long *)(lStack_50 + 0x10);
      pcVar12 = (char *)ft_mem_alloc(pFVar3,(ulong)(face->var_postscript_prefix_len +
                                                    mm_var._4_4_ * 0x11 + 1),
                                     (FT_Error *)(local_5c + 2));
      uVar22 = 0;
      if (local_5c[2] != 0) goto LAB_002195f7;
      strcpy(pcVar12,face->var_postscript_prefix);
      pbVar30 = (byte *)(pcVar12 + face->var_postscript_prefix_len);
      for (; uVar22 < mm_var._4_4_; uVar22 = uVar22 + 1) {
        pbVar32 = pbVar30;
        if (*(long *)_iStack_40 != *(long *)(lVar16 + 0x10)) {
          pbVar32 = pbVar30 + 1;
          *pbVar30 = 0x5f;
          uVar24 = *_iStack_40;
          if (uVar24 == 0) {
            pbVar30[1] = 0x30;
            pbVar32 = pbVar30 + 2;
          }
          else {
            if ((int)uVar24 < 0) {
              pbVar30[1] = 0x2d;
              pbVar32 = pbVar30 + 2;
              uVar24 = -uVar24;
            }
            pbVar30 = (byte *)&local_68;
            for (uVar23 = uVar24 >> 0x10; uVar23 != 0; uVar23 = uVar23 / 10) {
              *pbVar30 = (byte)((ulong)uVar23 % 10) | 0x30;
              pbVar30 = pbVar30 + 1;
            }
            for (lVar29 = 0; &local_68 < pbVar30 + lVar29; lVar29 = lVar29 + -1) {
              *pbVar32 = pbVar30[lVar29 + -1];
              pbVar32 = pbVar32 + 1;
            }
            if ((uVar24 & 0xffff) != 0) {
              *pbVar32 = 0x2e;
              uVar24 = (uVar24 & 0xffff) * 10 + 5;
              bVar8 = 0x2e;
              for (lVar29 = 0; (int)lVar29 != 5; lVar29 = lVar29 + 1) {
                bVar8 = (char)(uVar24 >> 0x10) + 0x30;
                pbVar32[lVar29 + 1] = bVar8;
                if ((uVar24 & 0xffff) == 0) {
                  pbVar32 = pbVar32 + lVar29 + 1;
                  if (lVar29 != 4) goto LAB_00219858;
                  if (bVar8 == 0x31) goto LAB_00219845;
                  goto LAB_0021984c;
                }
                uVar24 = (uVar24 & 0xffff) * 10;
              }
              pbVar32 = pbVar32 + lVar29;
              if ((lVar29 == 5) && (uVar24 < 0x542e0)) {
                if (bVar8 == 0x31) {
LAB_00219845:
                  *pbVar32 = 0x30;
LAB_00219850:
                  bVar8 = 0x30;
                }
                else if (uVar24 == 0x2a120) {
                  if ((bVar8 & 1) != 0) {
LAB_00219854:
                    bVar8 = bVar8 - 1;
                    *pbVar32 = bVar8;
                  }
                }
                else if (uVar24 < 0x2a120) {
LAB_0021984c:
                  if (bVar8 == 0x30) goto LAB_00219850;
                  goto LAB_00219854;
                }
              }
LAB_00219858:
              pbVar32 = pbVar32 + 1;
              while (bVar8 == 0x30) {
                pbVar32[-1] = 0;
                pbVar30 = pbVar32 + -2;
                pbVar32 = pbVar32 + -1;
                bVar8 = *pbVar30;
              }
            }
          }
          uVar15 = *(undefined8 *)(lVar16 + 0x20);
          if (((uint)((ulong)uVar15 >> 0x18) & 0xff) != 0x20) {
            bVar8 = (byte)((ulong)uVar15 >> 0x18);
            iVar25 = (int)(char)bVar8;
            if (iVar25 - 0x61U < 0x1a || (iVar25 - 0x41U < 0x1a || iVar25 - 0x30U < 10)) {
              *pbVar32 = bVar8;
              pbVar32 = pbVar32 + 1;
              uVar15 = *(undefined8 *)(lVar16 + 0x20);
            }
          }
          bVar8 = (byte)((ulong)uVar15 >> 0x10);
          if ((bVar8 != 0x20) &&
             (iVar25 = (int)(char)bVar8,
             iVar25 - 0x61U < 0x1a || (iVar25 - 0x41U < 0x1a || iVar25 - 0x30U < 10))) {
            *pbVar32 = bVar8;
            pbVar32 = pbVar32 + 1;
            uVar15 = *(undefined8 *)(lVar16 + 0x20);
          }
          bVar8 = (byte)((ulong)uVar15 >> 8);
          if ((bVar8 != 0x20) &&
             (iVar25 = (int)(char)bVar8,
             iVar25 - 0x61U < 0x1a || (iVar25 - 0x41U < 0x1a || iVar25 - 0x30U < 10))) {
            *pbVar32 = bVar8;
            pbVar32 = pbVar32 + 1;
            uVar15 = *(undefined8 *)(lVar16 + 0x20);
          }
          bVar8 = (byte)uVar15;
          if ((bVar8 != 0x20) &&
             (iVar25 = (int)(char)bVar8,
             iVar25 - 0x61U < 0x1a || (iVar25 - 0x41U < 0x1a || iVar25 - 0x30U < 10))) {
            *pbVar32 = bVar8;
            pbVar32 = pbVar32 + 1;
          }
        }
        _iStack_40 = _iStack_40 + 2;
        lVar16 = lVar16 + 0x30;
        pbVar30 = pbVar32;
      }
    }
    else {
      pvVar6 = face->sfnt;
      lVar16 = *(long *)(lStack_50 + 0x18);
      lVar29 = ((uVar28 >> 0x10) - 1) * 0x10;
      iVar25 = *(int *)(lVar16 + 0xc + lVar29);
      local_68 = (char *)0x0;
      if (iVar25 == 6 || iVar25 - 0x100U < 0x7f00) {
        (**(code **)((long)pvVar6 + 0xe8))(face,(short)iVar25,&local_68);
        pcVar12 = local_68;
        if (local_68 == (char *)0x0) {
          lVar16 = *(long *)(lStack_50 + 0x18);
          goto LAB_0021950f;
        }
        sVar13 = strlen(local_68);
        pbVar30 = (byte *)(pcVar12 + sVar13 + 1);
      }
      else {
LAB_0021950f:
        (**(code **)((long)pvVar6 + 0xe8))(face,*(undefined2 *)(lVar16 + 8 + lVar29),&local_70);
        if (local_70 == (char *)0x0) goto LAB_002195c8;
        FVar2 = face->var_postscript_prefix_len;
        sVar13 = strlen(local_70);
        pcVar12 = (char *)ft_mem_alloc(pFVar3,sVar13 + (FVar2 + 1) + 1,(FT_Error *)(local_5c + 2));
        if (local_5c[2] != 0) goto LAB_002195f7;
        strcpy(pcVar12,face->var_postscript_prefix);
        pcVar31 = pcVar12 + (ulong)face->var_postscript_prefix_len + 1;
        pcVar12[face->var_postscript_prefix_len] = '-';
        pcVar14 = local_70;
        while( true ) {
          cVar1 = *pcVar14;
          iVar25 = (int)cVar1;
          if (cVar1 == '\0') break;
          if (iVar25 - 0x61U < 0x1a || (iVar25 - 0x41U < 0x1a || iVar25 - 0x30U < 10)) {
            *pcVar31 = cVar1;
            pcVar31 = pcVar31 + 1;
          }
          pcVar14 = pcVar14 + 1;
        }
        *pcVar31 = '\0';
        pbVar30 = (byte *)(pcVar31 + 1);
        ft_mem_free(pFVar3,local_70);
      }
    }
    uVar28 = (long)pbVar30 - (long)pcVar12;
    if (0x7f < (long)uVar28) {
      uVar27 = (uint)uVar28;
      iVar25 = (int)((long)((ulong)(uint)((int)uVar27 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) / 0x10
                    );
      lVar29 = (long)iVar25;
      lVar16 = (long)(iVar25 << 4);
      piVar19 = (int *)(pcVar12 + lVar16 + lVar29 * -0x10 + 0xc);
      uVar26 = 0x75bcd15;
      uVar22 = 0x75bcd15;
      uVar23 = 0x75bcd15;
      uVar24 = 0x75bcd15;
      while (bVar33 = lVar29 != 0, lVar29 = lVar29 + -1, bVar33) {
        uVar24 = ((uint)(piVar19[-3] * 0x239b961b) >> 0x11 | piVar19[-3] * -0x34f28000) *
                 -0x54f16877 ^ uVar24;
        iVar25 = (uVar24 << 0x13 | uVar24 >> 0xd) + uVar23;
        uVar23 = ((uint)(piVar19[-2] * -0x54f16877) >> 0x10 | piVar19[-2] * -0x68770000) *
                 0x38b34ae5 ^ uVar23;
        uVar24 = iVar25 * 5 + 0x561ccd1b;
        uVar23 = ((uVar23 << 0x11 | uVar23 >> 0xf) + uVar22) * 5 + 0xbcaa747;
        uVar22 = ((uint)(piVar19[-1] * 0x38b34ae5) >> 0xf | piVar19[-1] * -0x6a360000) * -0x5e1c746d
                 ^ uVar22;
        uVar20 = ((uint)(*piVar19 * -0x5e1c746d) >> 0xe | *piVar19 * 0x2e4c0000) * 0x239b961b ^
                 uVar26;
        uVar22 = ((uVar22 << 0xf | uVar22 >> 0x11) + uVar26) * 5 + 0x96cd1c35;
        uVar26 = ((uVar20 << 0xd | uVar20 >> 0x13) + iVar25 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
        piVar19 = piVar19 + 4;
      }
      uVar17 = 0;
      uVar20 = 0;
      switch(uVar27 & 0xf) {
      case 0xf:
        uVar20 = (uint)(byte)pcVar12[lVar16 + 0xe] << 0x10;
      case 0xe:
        uVar20 = uVar20 | (uint)(byte)pcVar12[lVar16 + 0xd] << 8;
      case 0xd:
        uVar26 = uVar26 ^ (((byte)pcVar12[lVar16 + 0xc] ^ uVar20) * -0x5e1c746d >> 0xe |
                          ((byte)pcVar12[lVar16 + 0xc] ^ uVar20) * 0x2e4c0000) * 0x239b961b;
      case 0xc:
        uVar20 = (uint)(byte)pcVar12[lVar16 + 0xb] << 0x18;
      case 0xb:
        uVar20 = uVar20 | (uint)(byte)pcVar12[lVar16 + 10] << 0x10;
      case 10:
        uVar20 = uVar20 ^ (uint)(byte)pcVar12[lVar16 + 9] << 8;
      case 9:
        uVar22 = uVar22 ^ (((byte)pcVar12[lVar16 + 8] ^ uVar20) * 0x38b34ae5 >> 0xf |
                          ((byte)pcVar12[lVar16 + 8] ^ uVar20) * -0x6a360000) * -0x5e1c746d;
      case 8:
        uVar20 = (uint)(byte)pcVar12[lVar16 + 7] << 0x18;
      case 7:
        uVar20 = uVar20 | (uint)(byte)pcVar12[lVar16 + 6] << 0x10;
      case 6:
        uVar20 = uVar20 ^ (uint)(byte)pcVar12[lVar16 + 5] << 8;
      case 5:
        uVar23 = uVar23 ^ (((byte)pcVar12[lVar16 + 4] ^ uVar20) * -0x54f16877 >> 0x10 |
                          ((byte)pcVar12[lVar16 + 4] ^ uVar20) * -0x68770000) * 0x38b34ae5;
      case 4:
        uVar20 = (uint)(byte)pcVar12[lVar16 + 3] << 0x18;
      case 3:
        uVar17 = uVar20 | (uint)(byte)pcVar12[lVar16 + 2] << 0x10;
      case 2:
        uVar17 = uVar17 ^ (uint)(byte)pcVar12[lVar16 + 1] << 8;
      case 1:
        uVar24 = uVar24 ^ (((byte)pcVar12[lVar16] ^ uVar17) * 0x239b961b >> 0x11 |
                          ((byte)pcVar12[lVar16] ^ uVar17) * -0x34f28000) * -0x54f16877;
      case 0:
        FVar21 = (uVar24 ^ uVar27) + (uVar23 ^ uVar27) + (uVar22 ^ uVar27) + (uVar26 ^ uVar27);
        FVar9 = fmix32(FVar21);
        FVar10 = fmix32((uVar23 ^ uVar27) + FVar21);
        FVar11 = fmix32((uVar22 ^ uVar27) + FVar21);
        FVar21 = fmix32((uVar26 ^ uVar27) + FVar21);
        iVar25 = FVar9 + FVar10 + FVar11 + FVar21;
        puVar18 = local_5c;
        local_68 = (char *)CONCAT44(FVar10 + iVar25,iVar25);
        win = FVar11 + iVar25;
        local_5c[0] = FVar21 + iVar25;
        pcVar14 = pcVar12 + face->var_postscript_prefix_len;
        pcVar31 = pcVar14 + 0x20;
        *pcVar14 = '-';
        pcVar14[0x21] = '.';
        pcVar14[0x22] = '.';
        pcVar14[0x23] = '.';
        pcVar14[0x24] = '\0';
        for (iVar25 = 0; iVar25 != 4; iVar25 = iVar25 + 1) {
          uVar22 = *puVar18;
          for (lVar16 = 0; (int)lVar16 != -8; lVar16 = lVar16 + -1) {
            pcVar31[lVar16] = "0123456789ABCDEF"[uVar22 & 0xf];
            uVar22 = uVar22 >> 4;
          }
          puVar18 = puVar18 + -1;
          pcVar31 = pcVar31 + lVar16;
        }
      }
    }
  }
LAB_00219b85:
  face->postscript_name = pcVar12;
  return pcVar12;
}

Assistant:

static const char*
  sfnt_get_ps_name( TT_Face  face )
  {
    FT_Int       found, win, apple;
    const char*  result = NULL;


    if ( face->postscript_name )
      return face->postscript_name;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( face->blend                                 &&
         ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) ||
           FT_IS_VARIATION( FT_FACE( face ) )      ) )
    {
      face->postscript_name = sfnt_get_var_ps_name( face );
      return face->postscript_name;
    }
#endif

    /* scan the name table to see whether we have a Postscript name here, */
    /* either in Macintosh or Windows platform encodings                  */
    found = sfnt_get_name_id( face, TT_NAME_ID_PS_NAME, &win, &apple );
    if ( !found )
      return NULL;

    /* prefer Windows entries over Apple */
    if ( win != -1 )
      result = get_win_string( face->root.memory,
                               face->name_table.stream,
                               face->name_table.names + win,
                               sfnt_is_postscript,
                               1 );
    else
      result = get_apple_string( face->root.memory,
                                 face->name_table.stream,
                                 face->name_table.names + apple,
                                 sfnt_is_postscript,
                                 1 );

    face->postscript_name = result;

    return result;
  }